

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i *palVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [24];
  __m256i alVar12;
  __m256i alVar13;
  int iVar14;
  uint uVar15;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  __m256i vH_1;
  int16_t tmp2;
  int64_t tmp_2;
  __m256i *pv;
  __m256i *vP;
  __m256i vH;
  __m256i vF;
  __m256i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_16_t e;
  __m256i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int16_t *boundary;
  __m256i *pvE;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  long local_b00;
  long local_af8;
  undefined1 local_ae0 [64];
  __m256i local_aa0;
  undefined1 local_a80 [32];
  longlong local_a60;
  longlong lStack_a58;
  longlong lStack_a50;
  longlong lStack_a48;
  longlong local_a20;
  longlong lStack_a18;
  longlong lStack_a10;
  longlong lStack_a08;
  longlong local_a00;
  longlong lStack_9f8;
  longlong lStack_9f0;
  longlong lStack_9e8;
  int local_9d0;
  int local_9cc;
  parasail_result_t *local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 auStack_970 [16];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  ushort local_926;
  ushort local_924;
  ushort local_922;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  int16_t *local_8c8;
  __m256i *local_8c0;
  __m256i *local_8b8;
  __m256i *local_8b0;
  long local_8a8;
  int local_8a0;
  int local_89c;
  int local_898;
  int local_894;
  long local_890;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  uint local_86c;
  uint local_868;
  int local_864;
  long local_860;
  parasail_result_t *local_850;
  ushort local_848;
  ushort local_846;
  ushort local_844;
  ushort local_842;
  longlong local_840;
  longlong lStack_838;
  longlong lStack_830;
  longlong lStack_828;
  __m256i *local_808;
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  __m256i *local_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  __m256i *local_788;
  __m256i *local_748;
  __m256i *local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  longlong local_6e0;
  longlong lStack_6d8;
  longlong lStack_6d0;
  longlong lStack_6c8;
  __m256i *local_6a8;
  __m256i *local_6a0;
  __m256i *local_698;
  __m256i *local_690;
  undefined1 (*local_688) [32];
  longlong local_680;
  longlong lStack_678;
  longlong lStack_670;
  longlong lStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  longlong lStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  longlong local_580;
  longlong lStack_578;
  longlong lStack_570;
  longlong lStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  longlong lStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  longlong local_4c0;
  longlong lStack_4b8;
  longlong lStack_4b0;
  longlong lStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  longlong lStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  longlong local_400;
  longlong lStack_3f8;
  longlong lStack_3f0;
  longlong lStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  longlong local_360;
  longlong lStack_358;
  longlong lStack_350;
  longlong lStack_348;
  undefined1 local_340 [16];
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  longlong lStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  longlong lStack_290;
  longlong lStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  ushort local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  ushort local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  undefined1 local_100 [32];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ushort local_a0;
  ushort local_9e;
  ushort local_9c;
  ushort local_9a;
  ushort local_98;
  ushort local_96;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  ushort local_8a;
  ushort local_88;
  ushort local_86;
  ushort local_84;
  ushort local_82;
  undefined1 local_80 [32];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  local_870 = 0;
  local_874 = 0;
  local_878 = 0;
  local_87c = 0;
  local_880 = 0;
  local_884 = 0;
  local_890 = 0;
  local_894 = 0;
  local_898 = 0;
  local_89c = 0;
  local_8a0 = 0;
  local_8a8 = 0;
  local_8b0 = (__m256i *)0x0;
  local_8b8 = (__m256i *)0x0;
  local_8c0 = (__m256i *)0x0;
  local_8c8 = (int16_t *)0x0;
  local_922 = 0;
  local_924 = 0;
  local_926 = 0;
  local_9c8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_16","profile");
    local_850 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x30) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_16",
            "profile->profile16.score");
    local_850 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_16","profile->matrix");
    local_850 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_striped_profile_avx2_256_16",
            "profile->s1Len");
    local_850 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_striped_profile_avx2_256_16","s2");
    local_850 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_striped_profile_avx2_256_16","s2Len");
    local_850 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_striped_profile_avx2_256_16","open");
    local_850 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_striped_profile_avx2_256_16","gap");
    local_850 = (parasail_result_t *)0x0;
  }
  else {
    local_870 = 0;
    local_874 = 0;
    local_878 = 0;
    local_87c = *(int *)(in_RDI + 8);
    local_880 = local_87c + -1;
    local_884 = in_EDX + -1;
    local_890 = *(long *)(in_RDI + 0x10);
    local_894 = 0x10;
    local_898 = (local_87c + 0xf) / 0x10;
    local_89c = (local_87c + -1) % local_898;
    local_8a0 = ~((local_87c + -1) / local_898) + 0x10;
    local_8a8 = *(long *)(in_RDI + 0x30);
    local_868._0_2_ = (ushort)in_ECX;
    local_842 = (ushort)local_868;
    local_102 = (ushort)local_868;
    local_104 = (ushort)local_868;
    local_106 = (ushort)local_868;
    local_108 = (ushort)local_868;
    local_10a = (ushort)local_868;
    local_10c = (ushort)local_868;
    local_10e = (ushort)local_868;
    local_110 = (ushort)local_868;
    local_112 = (ushort)local_868;
    local_114 = (ushort)local_868;
    local_116 = (ushort)local_868;
    local_118 = (ushort)local_868;
    local_11a = (ushort)local_868;
    local_11c = (ushort)local_868;
    local_11e = (ushort)local_868;
    local_120 = (ushort)local_868;
    auVar2 = vpinsrw_avx(ZEXT216((ushort)local_868),in_ECX & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,6);
    local_140 = vpinsrw_avx(auVar2,in_ECX & 0xffff,7);
    auVar2 = vpinsrw_avx(ZEXT216((ushort)local_868),in_ECX & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,in_ECX & 0xffff,6);
    auStack_130 = vpinsrw_avx(auVar2,in_ECX & 0xffff,7);
    local_900 = local_140._0_8_;
    uStack_8f8 = local_140._8_8_;
    uStack_8f0 = auStack_130._0_8_;
    uStack_8e8 = auStack_130._8_8_;
    local_86c._0_2_ = (ushort)in_R8D;
    local_844 = (ushort)local_86c;
    local_c2 = (ushort)local_86c;
    local_c4 = (ushort)local_86c;
    local_c6 = (ushort)local_86c;
    local_c8 = (ushort)local_86c;
    local_ca = (ushort)local_86c;
    local_cc = (ushort)local_86c;
    local_ce = (ushort)local_86c;
    local_d0 = (ushort)local_86c;
    local_d2 = (ushort)local_86c;
    local_d4 = (ushort)local_86c;
    local_d6 = (ushort)local_86c;
    local_d8 = (ushort)local_86c;
    local_da = (ushort)local_86c;
    local_dc = (ushort)local_86c;
    local_de = (ushort)local_86c;
    local_e0 = (ushort)local_86c;
    auVar2 = vpinsrw_avx(ZEXT216((ushort)local_86c),in_R8D & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,6);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,7);
    auVar3 = vpinsrw_avx(ZEXT216((ushort)local_86c),in_R8D & 0xffff,1);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,2);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,3);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,4);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,5);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,6);
    auVar3 = vpinsrw_avx(auVar3,in_R8D & 0xffff,7);
    local_100._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    local_100._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    if (*(int *)(local_890 + 0x20) <= (int)-in_ECX) {
      local_868._0_2_ = -(short)*(undefined4 *)(local_890 + 0x20);
    }
    local_926 = (ushort)local_868 + 0x8001;
    local_924 = ((ushort)*(undefined4 *)(local_890 + 0x1c) ^ 0x7fff) - 1;
    auVar2 = vpinsrw_avx(ZEXT216(local_926),(uint)local_926,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,6);
    local_c0 = vpinsrw_avx(auVar2,(uint)local_926,7);
    auVar2 = vpinsrw_avx(ZEXT216(local_926),(uint)local_926,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_926,6);
    auStack_b0 = vpinsrw_avx(auVar2,(uint)local_926,7);
    local_960 = local_c0._0_8_;
    uStack_958 = local_c0._8_8_;
    uStack_950 = auStack_b0._0_8_;
    uStack_948 = auStack_b0._8_8_;
    auVar2 = vpinsrw_avx(ZEXT216(local_924),(uint)local_924,1);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_924,2);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_924,3);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_924,4);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_924,5);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_924,6);
    auVar2 = vpinsrw_avx(auVar2,(uint)local_924,7);
    auVar3 = vpinsrw_avx(ZEXT216(local_924),(uint)local_924,1);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_924,2);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_924,3);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_924,4);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_924,5);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_924,6);
    auVar3 = vpinsrw_avx(auVar3,(uint)local_924,7);
    auVar16._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar16._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_80._16_8_ = auVar16._16_8_;
    local_80._24_8_ = auVar16._24_8_;
    local_9a0._16_8_ = local_80._16_8_;
    local_9a0._0_16_ = auVar16._0_16_;
    local_9a0._24_8_ = local_80._24_8_;
    local_9c0._16_8_ = auStack_b0._0_8_;
    local_9c0._0_16_ = local_c0;
    local_9c0._24_8_ = auStack_b0._8_8_;
    auVar17 = ZEXT1664(auVar2);
    local_922 = local_926;
    local_86c = in_R8D;
    local_868 = in_ECX;
    local_864 = in_EDX;
    local_860 = in_RSI;
    local_848 = local_924;
    local_846 = local_926;
    local_a0 = local_926;
    local_9e = local_926;
    local_9c = local_926;
    local_9a = local_926;
    local_98 = local_926;
    local_96 = local_926;
    local_94 = local_926;
    local_92 = local_926;
    local_90 = local_926;
    local_8e = local_926;
    local_8c = local_926;
    local_8a = local_926;
    local_88 = local_926;
    local_86 = local_926;
    local_84 = local_926;
    local_82 = local_926;
    local_80 = auVar16;
    local_50 = local_924;
    local_4e = local_924;
    local_4c = local_924;
    local_4a = local_924;
    local_48 = local_924;
    local_46 = local_924;
    local_44 = local_924;
    local_42 = local_924;
    local_40 = local_924;
    local_3e = local_924;
    local_3c = local_924;
    local_3a = local_924;
    local_38 = local_924;
    local_36 = local_924;
    local_34 = local_924;
    local_32 = local_924;
    local_920 = local_100._0_16_;
    auStack_910 = local_100._16_16_;
    local_980 = auVar16._0_16_;
    auStack_970 = auVar16._16_16_;
    local_9c8 = parasail_result_new();
    if (local_9c8 == (parasail_result_t *)0x0) {
      local_850 = (parasail_result_t *)0x0;
    }
    else {
      local_9c8->flag = local_9c8->flag | 0x10200801;
      local_8b0 = parasail_memalign___m256i(0x20,(long)local_898);
      local_8b8 = parasail_memalign___m256i(0x20,(long)local_898);
      local_8c0 = parasail_memalign___m256i(0x20,(long)local_898);
      local_8c8 = parasail_memalign_int16_t(0x20,(long)(local_864 + 1));
      if (local_8b0 == (__m256i *)0x0) {
        local_850 = (parasail_result_t *)0x0;
      }
      else if (local_8b8 == (__m256i *)0x0) {
        local_850 = (parasail_result_t *)0x0;
      }
      else if (local_8c0 == (__m256i *)0x0) {
        local_850 = (parasail_result_t *)0x0;
      }
      else if (local_8c8 == (int16_t *)0x0) {
        local_850 = (parasail_result_t *)0x0;
      }
      else {
        local_9cc = 0;
        local_870 = 0;
        while( true ) {
          if (local_898 <= local_870) break;
          for (local_9d0 = 0; local_9d0 < local_894; local_9d0 = local_9d0 + 1) {
            local_b00 = (long)(int)(-(local_86c * (local_9d0 * local_898 + local_870)) - local_868);
            local_af8 = local_b00;
            if (local_b00 < -0x8000) {
              local_af8 = -0x8000;
            }
            *(short *)((long)&local_a00 + (long)local_9d0 * 2) = (short)local_af8;
            local_b00 = local_b00 - (int)local_868;
            if (local_b00 < -0x8000) {
              local_b00 = -0x8000;
            }
            *(short *)((long)&local_a20 + (long)local_9d0 * 2) = (short)local_b00;
          }
          local_708 = local_8b0 + local_9cc;
          (*local_708)[0] = local_a00;
          (*local_708)[1] = lStack_9f8;
          (*local_708)[2] = lStack_9f0;
          (*local_708)[3] = lStack_9e8;
          local_748 = local_8c0 + local_9cc;
          (*local_748)[0] = local_a20;
          (*local_748)[1] = lStack_a18;
          (*local_748)[2] = lStack_a10;
          (*local_748)[3] = lStack_a08;
          local_9cc = local_9cc + 1;
          local_870 = local_870 + 1;
        }
        *local_8c8 = 0;
        for (local_870 = 1; local_870 <= local_864; local_870 = local_870 + 1) {
          iVar14 = -(local_86c * (local_870 + -1)) - local_868;
          if (iVar14 < -0x8000) {
            iVar14 = -0x8000;
          }
          local_8c8[local_870] = (int16_t)iVar14;
        }
        for (local_874 = 0; local_874 < local_864; local_874 = local_874 + 1) {
          local_a80._8_8_ = uStack_958;
          local_a80._0_8_ = local_960;
          local_a80._16_8_ = uStack_950;
          local_a80._24_8_ = uStack_948;
          auVar16 = vperm2i128_avx2(auVar17._0_32_,(undefined1  [32])local_8b0[local_898 + -1],0x28)
          ;
          auVar16 = vpalignr_avx2((undefined1  [32])local_8b0[local_898 + -1],auVar16,0xe);
          iVar14 = *(int *)(*(long *)(local_890 + 0x10) +
                           (ulong)*(byte *)(local_860 + local_874) * 4);
          palVar1 = local_8b8;
          auVar2 = vpinsrw_avx(auVar16._0_16_,(uint)(ushort)local_8c8[local_874],0);
          auVar17 = ZEXT1664(auVar2);
          local_aa0 = (__m256i)vblendps_avx(auVar16,ZEXT1632(auVar2),0xf);
          for (local_870 = 0; local_870 < local_898; local_870 = local_870 + 1) {
            local_6e0 = local_aa0[0];
            lStack_6d8 = local_aa0[1];
            lStack_6d0 = local_aa0[2];
            lStack_6c8 = local_aa0[3];
            local_688 = (undefined1 (*) [32])
                        (local_8a8 + (long)(iVar14 * local_898) * 0x20 + (long)local_870 * 0x20);
            local_700 = *(undefined8 *)*local_688;
            uStack_6f8 = *(undefined8 *)(*local_688 + 8);
            uStack_6f0 = *(undefined8 *)(*local_688 + 0x10);
            uStack_6e8 = *(undefined8 *)(*local_688 + 0x18);
            auVar16 = vpaddsw_avx2((undefined1  [32])local_aa0,*local_688);
            local_690 = local_8c0 + local_870;
            auVar11 = *(undefined1 (*) [24])*local_690;
            lStack_4e8 = (*local_690)[3];
            alVar13 = *local_690;
            alVar12 = *local_690;
            local_aa0[0] = auVar16._0_8_;
            local_4e0 = local_aa0[0];
            local_aa0[1] = auVar16._8_8_;
            uStack_4d8 = local_aa0[1];
            local_aa0[2] = auVar16._16_8_;
            uStack_4d0 = local_aa0[2];
            local_aa0[3] = auVar16._24_8_;
            uStack_4c8 = local_aa0[3];
            local_a60 = auVar11._0_8_;
            local_500 = local_a60;
            lStack_a58 = auVar11._8_8_;
            uStack_4f8 = lStack_a58;
            lStack_a50 = auVar11._16_8_;
            uStack_4f0 = lStack_a50;
            auVar16 = vpmaxsw_avx2(auVar16,(undefined1  [32])*local_690);
            local_aa0[0] = auVar16._0_8_;
            local_520 = local_aa0[0];
            local_aa0[1] = auVar16._8_8_;
            uStack_518 = local_aa0[1];
            local_aa0[2] = auVar16._16_8_;
            uStack_510 = local_aa0[2];
            local_aa0[3] = auVar16._24_8_;
            uStack_508 = local_aa0[3];
            local_540 = local_a80._0_8_;
            uStack_538 = local_a80._8_8_;
            uStack_530 = local_a80._16_8_;
            uStack_528 = local_a80._24_8_;
            auVar16 = vpmaxsw_avx2(auVar16,local_a80);
            local_788 = local_8b8 + local_870;
            local_aa0[0] = auVar16._0_8_;
            local_7c0 = local_aa0[0];
            local_aa0[1] = auVar16._8_8_;
            lStack_7b8 = local_aa0[1];
            local_aa0[2] = auVar16._16_8_;
            lStack_7b0 = local_aa0[2];
            local_aa0[3] = auVar16._24_8_;
            lStack_7a8 = local_aa0[3];
            (*local_788)[0] = local_aa0[0];
            (*local_788)[1] = local_aa0[1];
            (*local_788)[2] = local_aa0[2];
            (*local_788)[3] = local_aa0[3];
            local_560 = local_9c0._0_8_;
            uStack_558 = local_9c0._8_8_;
            uStack_550 = local_9c0._16_8_;
            uStack_548 = local_9c0._24_8_;
            local_580 = local_aa0[0];
            lStack_578 = local_aa0[1];
            lStack_570 = local_aa0[2];
            lStack_568 = local_aa0[3];
            local_9c0 = vpmaxsw_avx2(local_9c0,auVar16);
            local_3e0 = local_9a0._0_8_;
            uStack_3d8 = local_9a0._8_8_;
            uStack_3d0 = local_9a0._16_8_;
            uStack_3c8 = local_9a0._24_8_;
            local_400 = local_aa0[0];
            lStack_3f8 = local_aa0[1];
            lStack_3f0 = local_aa0[2];
            lStack_3e8 = local_aa0[3];
            auVar4 = vpminsw_avx2(local_9a0,auVar16);
            local_9a0._0_8_ = auVar4._0_8_;
            local_420 = local_9a0._0_8_;
            local_9a0._8_8_ = auVar4._8_8_;
            uStack_418 = local_9a0._8_8_;
            local_9a0._16_8_ = auVar4._16_8_;
            uStack_410 = local_9a0._16_8_;
            local_9a0._24_8_ = auVar4._24_8_;
            uStack_408 = local_9a0._24_8_;
            local_440 = local_a60;
            uStack_438 = lStack_a58;
            uStack_430 = lStack_a50;
            auVar4 = vpminsw_avx2(auVar4,(undefined1  [32])alVar12);
            local_9a0._0_8_ = auVar4._0_8_;
            local_460 = local_9a0._0_8_;
            local_9a0._8_8_ = auVar4._8_8_;
            uStack_458 = local_9a0._8_8_;
            local_9a0._16_8_ = auVar4._16_8_;
            uStack_450 = local_9a0._16_8_;
            local_9a0._24_8_ = auVar4._24_8_;
            uStack_448 = local_9a0._24_8_;
            local_480 = local_a80._0_8_;
            uStack_478 = local_a80._8_8_;
            uStack_470 = local_a80._16_8_;
            uStack_468 = local_a80._24_8_;
            local_9a0 = vpminsw_avx2(auVar4,local_a80);
            local_2a0 = local_aa0[0];
            lStack_298 = local_aa0[1];
            lStack_290 = local_aa0[2];
            lStack_288 = local_aa0[3];
            local_2c0 = local_900;
            uStack_2b8 = uStack_8f8;
            uStack_2b0 = uStack_8f0;
            uStack_2a8 = uStack_8e8;
            auVar4._8_8_ = uStack_8f8;
            auVar4._0_8_ = local_900;
            auVar4._16_8_ = uStack_8f0;
            auVar4._24_8_ = uStack_8e8;
            auVar4 = vpsubsw_avx2(auVar16,auVar4);
            local_2e0 = local_a60;
            uStack_2d8 = lStack_a58;
            uStack_2d0 = lStack_a50;
            uStack_2f0 = auStack_910._0_8_;
            uStack_2e8 = auStack_910._8_8_;
            auVar8._16_8_ = auStack_910._0_8_;
            auVar8._0_16_ = local_920;
            auVar8._24_8_ = auStack_910._8_8_;
            auVar16 = vpsubsw_avx2((undefined1  [32])alVar13,auVar8);
            local_a60 = auVar16._0_8_;
            local_5a0 = local_a60;
            lStack_a58 = auVar16._8_8_;
            uStack_598 = lStack_a58;
            lStack_a50 = auVar16._16_8_;
            uStack_590 = lStack_a50;
            lStack_a48 = auVar16._24_8_;
            uStack_588 = lStack_a48;
            local_aa0[0] = auVar4._0_8_;
            local_5c0 = local_aa0[0];
            local_aa0[1] = auVar4._8_8_;
            uStack_5b8 = local_aa0[1];
            local_aa0[2] = auVar4._16_8_;
            uStack_5b0 = local_aa0[2];
            local_aa0[3] = auVar4._24_8_;
            uStack_5a8 = local_aa0[3];
            auVar16 = vpmaxsw_avx2(auVar16,auVar4);
            local_7c8 = local_8c0 + local_870;
            local_a60 = auVar16._0_8_;
            local_800 = local_a60;
            lStack_a58 = auVar16._8_8_;
            lStack_7f8 = lStack_a58;
            lStack_a50 = auVar16._16_8_;
            lStack_7f0 = lStack_a50;
            lStack_a48 = auVar16._24_8_;
            lStack_7e8 = lStack_a48;
            (*local_7c8)[0] = local_a60;
            (*local_7c8)[1] = lStack_a58;
            (*local_7c8)[2] = lStack_a50;
            (*local_7c8)[3] = lStack_a48;
            local_320 = local_a80._0_8_;
            uStack_318 = local_a80._8_8_;
            uStack_310 = local_a80._16_8_;
            uStack_308 = local_a80._24_8_;
            uStack_330 = auStack_910._0_8_;
            uStack_328 = auStack_910._8_8_;
            auVar7._16_8_ = auStack_910._0_8_;
            auVar7._0_16_ = local_920;
            auVar7._24_8_ = auStack_910._8_8_;
            auVar16 = vpsubsw_avx2(local_a80,auVar7);
            local_a80._0_8_ = auVar16._0_8_;
            local_5e0 = local_a80._0_8_;
            local_a80._8_8_ = auVar16._8_8_;
            uStack_5d8 = local_a80._8_8_;
            local_a80._16_8_ = auVar16._16_8_;
            uStack_5d0 = local_a80._16_8_;
            local_a80._24_8_ = auVar16._24_8_;
            uStack_5c8 = local_a80._24_8_;
            local_600 = local_aa0[0];
            uStack_5f8 = local_aa0[1];
            uStack_5f0 = local_aa0[2];
            uStack_5e8 = local_aa0[3];
            auVar17 = ZEXT3264(auVar4);
            local_a80 = vpmaxsw_avx2(auVar16,auVar4);
            local_698 = local_8b0 + local_870;
            local_aa0 = *local_698;
            lStack_428 = lStack_4e8;
            lStack_2c8 = lStack_4e8;
            local_300 = local_920;
            local_340 = local_920;
          }
          for (local_878 = 0; local_878 < local_894; local_878 = local_878 + 1) {
            uVar15 = (int)local_8c8[local_874 + 1] - local_868;
            if ((int)uVar15 < -0x8000) {
              uVar15 = 0xffff8000;
            }
            auVar16 = vperm2i128_avx2(auVar17._0_32_,local_a80,0x28);
            auVar16 = vpalignr_avx2(local_a80,auVar16,0xe);
            auVar2 = vpinsrw_avx(auVar16._0_16_,uVar15 & 0xffff,0);
            auVar17 = ZEXT1664(auVar2);
            local_a80 = vblendps_avx(auVar16,ZEXT1632(auVar2),0xf);
            for (local_870 = 0; local_870 < local_898; local_870 = local_870 + 1) {
              local_6a0 = local_8b8 + local_870;
              auVar11 = *(undefined1 (*) [24])*local_6a0;
              lStack_608 = (*local_6a0)[3];
              local_aa0[0] = auVar11._0_8_;
              local_620 = local_aa0[0];
              local_aa0[1] = auVar11._8_8_;
              uStack_618 = local_aa0[1];
              local_aa0[2] = auVar11._16_8_;
              uStack_610 = local_aa0[2];
              local_640 = local_a80._0_8_;
              uStack_638 = local_a80._8_8_;
              uStack_630 = local_a80._16_8_;
              uStack_628 = local_a80._24_8_;
              auVar16 = vpmaxsw_avx2((undefined1  [32])*local_6a0,local_a80);
              local_808 = local_8b8 + local_870;
              local_aa0[0] = auVar16._0_8_;
              local_840 = local_aa0[0];
              local_aa0[1] = auVar16._8_8_;
              lStack_838 = local_aa0[1];
              local_aa0[2] = auVar16._16_8_;
              lStack_830 = local_aa0[2];
              local_aa0[3] = auVar16._24_8_;
              lStack_828 = local_aa0[3];
              (*local_808)[0] = local_aa0[0];
              (*local_808)[1] = local_aa0[1];
              (*local_808)[2] = local_aa0[2];
              (*local_808)[3] = local_aa0[3];
              local_4a0 = local_9a0._0_8_;
              uStack_498 = local_9a0._8_8_;
              uStack_490 = local_9a0._16_8_;
              uStack_488 = local_9a0._24_8_;
              local_4c0 = local_aa0[0];
              lStack_4b8 = local_aa0[1];
              lStack_4b0 = local_aa0[2];
              lStack_4a8 = local_aa0[3];
              local_9a0 = vpminsw_avx2(local_9a0,auVar16);
              local_660 = local_9c0._0_8_;
              uStack_658 = local_9c0._8_8_;
              uStack_650 = local_9c0._16_8_;
              uStack_648 = local_9c0._24_8_;
              local_680 = local_aa0[0];
              lStack_678 = local_aa0[1];
              lStack_670 = local_aa0[2];
              lStack_668 = local_aa0[3];
              local_9c0 = vpmaxsw_avx2(local_9c0,auVar16);
              local_360 = local_aa0[0];
              lStack_358 = local_aa0[1];
              lStack_350 = local_aa0[2];
              lStack_348 = local_aa0[3];
              local_380 = local_900;
              uStack_378 = uStack_8f8;
              uStack_370 = uStack_8f0;
              uStack_368 = uStack_8e8;
              auVar6._8_8_ = uStack_8f8;
              auVar6._0_8_ = local_900;
              auVar6._16_8_ = uStack_8f0;
              auVar6._24_8_ = uStack_8e8;
              auVar16 = vpsubsw_avx2(auVar16,auVar6);
              local_3a0 = local_a80._0_8_;
              uStack_398 = local_a80._8_8_;
              uStack_390 = local_a80._16_8_;
              uStack_388 = local_a80._24_8_;
              auVar5._16_8_ = auStack_910._0_8_;
              auVar5._0_16_ = local_920;
              auVar5._24_8_ = auStack_910._8_8_;
              local_a80 = vpsubsw_avx2(local_a80,auVar5);
              local_1a0 = local_a80._0_8_;
              uStack_198 = local_a80._8_8_;
              uStack_190 = local_a80._16_8_;
              uStack_188 = local_a80._24_8_;
              local_aa0[0] = auVar16._0_8_;
              local_1c0 = local_aa0[0];
              local_aa0[1] = auVar16._8_8_;
              uStack_1b8 = local_aa0[1];
              local_aa0[2] = auVar16._16_8_;
              uStack_1b0 = local_aa0[2];
              local_aa0[3] = auVar16._24_8_;
              uStack_1a8 = local_aa0[3];
              auVar17 = ZEXT3264(auVar16);
              local_260 = vpcmpgtw_avx2(local_a80,auVar16);
              auStack_3b0 = auStack_910;
              local_3c0 = local_920;
              if ((((((((((((((((((((((((((((((((local_260 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (local_260 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (local_260 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (local_260 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (local_260 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (local_260 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (local_260 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (local_260 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (local_260 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (local_260 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (local_260 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (local_260 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_260 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_260 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_260 >> 0x77 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_260 >> 0x7f,0) == '\0') &&
                                (local_260 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_260 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_260 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_260 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_260 >> 0xa7 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_260 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_260 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_260 >> 0xbf,0) == '\0') &&
                        (local_260 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_260 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_260 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_260 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_260 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_260 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_260 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < local_260[0x1f]) goto LAB_00bc97a6;
            }
          }
LAB_00bc97a6:
          local_8b8 = local_8b0;
          local_8b0 = palVar1;
        }
        local_6a8 = local_8b0 + local_89c;
        local_ae0._0_32_ = *(undefined1 (*) [32])local_6a8;
        for (local_878 = 0; local_878 < local_8a0; local_878 = local_878 + 1) {
          auVar16 = vperm2i128_avx2(auVar17._0_32_,local_ae0._0_32_,0x28);
          auVar17 = ZEXT3264(auVar16);
          local_ae0._0_32_ = vpalignr_avx2(local_ae0._0_32_,auVar16,0xe);
        }
        local_926 = local_ae0._30_2_;
        local_1e0 = local_960;
        uStack_1d8 = uStack_958;
        uStack_1d0 = uStack_950;
        uStack_1c8 = uStack_948;
        local_200 = local_9a0._0_8_;
        uStack_1f8 = local_9a0._8_8_;
        uStack_1f0 = local_9a0._16_8_;
        uStack_1e8 = local_9a0._24_8_;
        auVar10._8_8_ = uStack_958;
        auVar10._0_8_ = local_960;
        auVar10._16_8_ = uStack_950;
        auVar10._24_8_ = uStack_948;
        local_160 = vpcmpgtw_avx2(auVar10,local_9a0);
        local_220 = local_9c0._0_8_;
        uStack_218 = local_9c0._8_8_;
        uStack_210 = local_9c0._16_8_;
        uStack_208 = local_9c0._24_8_;
        auVar9._16_8_ = auStack_970._0_8_;
        auVar9._0_16_ = local_980;
        auVar9._24_8_ = auStack_970._8_8_;
        local_180 = vpcmpgtw_avx2(local_9c0,auVar9);
        local_280 = vpor_avx2(local_160,local_180);
        if ((((((((((((((((((((((((((((((((local_280 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_280 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_280 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_280 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_280 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_280 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_280 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_280 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_280 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_280 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_280 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_280 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_280 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_280 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_280 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_280 >> 0x7f,0) != '\0') ||
                          (local_280 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_280 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_280 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_280 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_280 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_280 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_280 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_280 >> 0xbf,0) != '\0') ||
                  (local_280 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_280 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_280 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_280 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_280 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_280 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_280 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_280[0x1f] < '\0') {
          local_9c8->flag = local_9c8->flag | 0x40;
          local_926 = 0;
          local_880 = 0;
          local_884 = 0;
        }
        local_9c8->score = (int)(short)local_926;
        local_9c8->end_query = local_880;
        local_9c8->end_ref = local_884;
        local_240 = local_980;
        auStack_230 = auStack_970;
        parasail_free(local_8c8);
        parasail_free(local_8c0);
        parasail_free(local_8b8);
        parasail_free(local_8b0);
        local_850 = local_9c8;
      }
    }
  }
  return local_850;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi16_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}